

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

void * google::protobuf::Arena::CopyConstruct<proto2_arena_unittest::NestedMessage>
                 (Arena *arena,void *from)

{
  undefined8 *puVar1;
  
  if (arena == (Arena *)0x0) {
    puVar1 = (undefined8 *)operator_new(0x20);
  }
  else {
    puVar1 = (undefined8 *)Allocate(arena,0x20);
  }
  puVar1[1] = arena;
  *puVar1 = &PTR__NestedMessage_019624d0;
  *(undefined4 *)(puVar1 + 3) = *(undefined4 *)((long)from + 0x18);
  puVar1[2] = *(undefined8 *)((long)from + 0x10);
  if ((*(ulong *)((long)from + 8) & 1) != 0) {
    protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              ((InternalMetadata *)(puVar1 + 1),
               (UnknownFieldSet *)((*(ulong *)((long)from + 8) & 0xfffffffffffffffe) + 8));
  }
  return puVar1;
}

Assistant:

PROTOBUF_NOINLINE void* PROTOBUF_NONNULL Arena::CopyConstruct(
    Arena* PROTOBUF_NULLABLE arena, const void* PROTOBUF_NONNULL from) {
  // If the object is larger than half a cache line, prefetch it.
  // This way of prefetching is a little more aggressive than if we
  // condition off a whole cache line, but benchmarks show better results.
  if (sizeof(T) > ABSL_CACHELINE_SIZE / 2) {
    PROTOBUF_PREFETCH_WITH_OFFSET(from, 64);
  }
  static_assert(is_destructor_skippable<T>::value, "");
  void* mem = arena != nullptr ? arena->AllocateAligned(sizeof(T))
                               : ::operator new(sizeof(T));
  return new (mem) T(arena, *static_cast<const T*>(from));
}